

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O2

void av1_alloc_cdef_sync(AV1_COMMON *cm,AV1CdefSync *cdef_sync,int num_workers)

{
  pthread_mutex_t *__mutex;
  
  if ((0 < num_workers) && (cdef_sync->mutex_ == (pthread_mutex_t *)0x0)) {
    __mutex = (pthread_mutex_t *)aom_malloc(0x28);
    cdef_sync->mutex_ = __mutex;
    if (__mutex == (pthread_mutex_t *)0x0) {
      aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate cdef_sync->mutex_");
      __mutex = cdef_sync->mutex_;
      if (__mutex == (pthread_mutex_t *)0x0) {
        return;
      }
    }
    pthread_mutex_init((pthread_mutex_t *)__mutex,(pthread_mutexattr_t *)0x0);
    return;
  }
  return;
}

Assistant:

void av1_alloc_cdef_sync(AV1_COMMON *const cm, AV1CdefSync *cdef_sync,
                         int num_workers) {
  if (num_workers < 1) return;
#if CONFIG_MULTITHREAD
  if (cdef_sync->mutex_ == NULL) {
    CHECK_MEM_ERROR(cm, cdef_sync->mutex_,
                    aom_malloc(sizeof(*(cdef_sync->mutex_))));
    if (cdef_sync->mutex_) pthread_mutex_init(cdef_sync->mutex_, NULL);
  }
#else
  (void)cm;
  (void)cdef_sync;
#endif  // CONFIG_MULTITHREAD
}